

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.cpp
# Opt level: O1

void __thiscall
duckdb::VectorArrayBuffer::VectorArrayBuffer
          (VectorArrayBuffer *this,LogicalType *array,idx_t initial)

{
  LogicalType *other;
  idx_t iVar1;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_00;
  pointer *__ptr;
  LogicalType LStack_48;
  
  VectorBuffer::VectorBuffer(&this->super_VectorBuffer,ARRAY_BUFFER);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorArrayBuffer_02478c90;
  other = ArrayType::GetChildType(array);
  iVar1 = ArrayType::GetSize(array);
  this_00._M_head_impl = (Vector *)operator_new(0x68);
  LogicalType::LogicalType(&LStack_48,other);
  Vector::Vector(this_00._M_head_impl,&LStack_48,iVar1 * initial);
  (this->child).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = this_00._M_head_impl;
  LogicalType::~LogicalType(&LStack_48);
  iVar1 = ArrayType::GetSize(array);
  this->array_size = iVar1;
  this->size = initial;
  return;
}

Assistant:

VectorArrayBuffer::VectorArrayBuffer(const LogicalType &array, idx_t initial)
    : VectorBuffer(VectorBufferType::ARRAY_BUFFER),
      child(make_uniq<Vector>(ArrayType::GetChildType(array), initial * ArrayType::GetSize(array))),
      array_size(ArrayType::GetSize(array)), size(initial) {
	// initialize the child array with (array_size * size) ^
	D_ASSERT(!ArrayType::IsAnySize(array));
}